

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_image.cpp
# Opt level: O2

bool __thiscall
Bitmap_Operation::BitmapInfoHeader::validate(BitmapInfoHeader *this,BitmapFileHeader *header)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  
  iVar1 = (*(this->super_BitmapDibHeader)._vptr_BitmapDibHeader[4])();
  uVar2 = (*(this->super_BitmapDibHeader)._vptr_BitmapDibHeader[6])(this);
  bVar3 = true;
  if (((((ulong)this->biBitCount < 0x21) &&
       ((0x101000100U >> ((ulong)this->biBitCount & 0x3f) & 1) != 0)) && (0 < this->biWidth)) &&
     (((0 < this->biHeight && (this->biSize == 0x28)) &&
      ((this->biSizeImage == this->biHeight * (iVar1 * (uVar2 & 0xff) + 3 & 0xfffffffc) ||
        this->biSizeImage == 0 && (this->biPlanes == 1)))))) {
    bVar3 = header->bfOffBits < header->overallSize + this->overallSize;
  }
  return bVar3;
}

Assistant:

virtual bool validate( const BitmapFileHeader & header )
        {
            uint32_t rowSize = width() * colorCount();
            if( rowSize % BITMAP_ALIGNMENT != 0 )
                rowSize = (rowSize / BITMAP_ALIGNMENT + 1) * BITMAP_ALIGNMENT;

            return !(biBitCount == 8u || biBitCount == 24u || biBitCount == 32u) ||
                biWidth <= 0 || biHeight <= 0 || biSize != BitmapInfoHeader().biSize ||
                (biSizeImage != rowSize * static_cast<uint32_t>(biHeight) && biSizeImage != 0) ||
                biPlanes != BitmapInfoHeader().biPlanes || header.bfOffBits < overallSize + header.overallSize;
        }